

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O3

void scalar_mult(scalar *out,scalar *lhs,scalar *rhs)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint16_t uVar5;
  long lVar6;
  
  lVar6 = 0;
  do {
    uVar1 = lhs->c[lVar6];
    uVar2 = rhs->c[lVar6];
    uVar3 = lhs->c[lVar6 + 1];
    uVar4 = rhs->c[lVar6 + 1];
    uVar5 = reduce((uint)uVar4 * (uint)uVar3);
    uVar5 = reduce((uint)*(ushort *)((long)kModRoots + lVar6) * (uint)uVar5 +
                   (uint)uVar2 * (uint)uVar1);
    out->c[lVar6] = uVar5;
    uVar5 = reduce((uint)uVar3 * (uint)uVar2 + (uint)uVar4 * (uint)uVar1);
    out->c[lVar6 + 1] = uVar5;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x100);
  return;
}

Assistant:

static void scalar_mult(scalar *out, const scalar *lhs, const scalar *rhs) {
  for (int i = 0; i < DEGREE / 2; i++) {
    uint32_t real_real = (uint32_t)lhs->c[2 * i] * rhs->c[2 * i];
    uint32_t img_img = (uint32_t)lhs->c[2 * i + 1] * rhs->c[2 * i + 1];
    uint32_t real_img = (uint32_t)lhs->c[2 * i] * rhs->c[2 * i + 1];
    uint32_t img_real = (uint32_t)lhs->c[2 * i + 1] * rhs->c[2 * i];
    out->c[2 * i] =
        reduce(real_real + (uint32_t)reduce(img_img) * kModRoots[i]);
    out->c[2 * i + 1] = reduce(img_real + real_img);
  }
}